

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O3

el_status_t c_complete(void)

{
  byte *pbVar1;
  el_status_t eVar2;
  char *token;
  byte *__s;
  size_t sVar3;
  byte *p;
  void *pvVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  int unique;
  int local_3c;
  size_t local_38;
  
  if (rl_inhibit_complete != 0) {
    return CSdispatch;
  }
  token = el_find_word();
  __s = (byte *)rl_complete(token,&local_3c);
  if (token != (char *)0x0) {
    free(token);
  }
  if (__s != (byte *)0x0) {
    sVar3 = strlen((char *)__s);
    p = (byte *)malloc(sVar3 * 2 + 1);
    if (p == (byte *)0x0) {
      free(__s);
      return CSstay;
    }
    bVar7 = *__s;
    pbVar1 = __s;
    local_38 = sVar3;
    pbVar6 = p;
    while (bVar7 != 0) {
      pbVar5 = pbVar1 + 1;
      if ((((char)bVar7 < ' ') ||
          (pvVar4 = memchr("\"#$&\'()*:;<=>?[\\]^`{|}~\n\t ",(uint)bVar7,0x1b),
          pvVar4 != (void *)0x0)) && ((local_3c == 0 || (*pbVar5 != 0)))) {
        *pbVar6 = 0x5c;
        pbVar6 = pbVar6 + 1;
        bVar7 = *pbVar1;
      }
      *pbVar6 = bVar7;
      pbVar6 = pbVar6 + 1;
      pbVar1 = pbVar5;
      bVar7 = *pbVar5;
    }
    *pbVar6 = 0;
    free(__s);
    if (local_38 != 0) {
      eVar2 = insert_string((char *)p);
      free(p);
      return eVar2;
    }
    free(p);
  }
  eVar2 = c_possible();
  return eVar2;
}

Assistant:

static el_status_t c_complete(void)
{
    char        *p, *q;
    char        *word, *string;
    size_t      len;
    int         unique;
    el_status_t s = CSdone;

    if (rl_inhibit_complete)
        return CSdispatch;

    word = el_find_word();
    p = rl_complete(word, &unique);
    if (word)
        free(word);
    if (p) {
        len = strlen(p);
        word = p;

        string = q = malloc(sizeof(char) * (2 * len + 1));
        if (!string) {
            free(word);
            return CSstay;
        }

        while (*p) {
            if ((*p < ' ' || strchr(SEPS, *p) != NULL)
                && (!unique || p[1] != 0)) {
                *q++ = '\\';
            }
            *q++ = *p++;
        }
        *q = '\0';
        free(word);

        if (len > 0) {
            s = insert_string(string);
#ifdef CONFIG_TERMINAL_BELL
            if (!unique)
                el_ring_bell();
#endif
        }
        free(string);

        if (len > 0)
            return s;
    }

    return c_possible();
}